

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

void density_tests::detail::
     single_queue_generic_test<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>
               (QueueTesterFlags i_flags,ostream *i_output,EasyRandom *i_random,
               size_t i_element_count,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *i_thread_count_vector)

{
  pointer puVar1;
  pointer puVar2;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  tester;
  runtime_type local_f8;
  EasyRandom *local_f0;
  size_t local_e8;
  ostream *local_e0;
  ostream *local_d8;
  _Hashtable<density::runtime_type<>,_std::pair<const_density::runtime_type<>,_unsigned_long>,_std::allocator<std::pair<const_density::runtime_type<>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<density::runtime_type<>_>,_std::hash<density::runtime_type<>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_d0;
  void *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  void *pvStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  void *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  void *pvStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  unsigned_long local_38;
  
  puVar2 = (i_thread_count_vector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (i_thread_count_vector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    local_f0 = i_random;
    local_e8 = i_element_count;
    local_e0 = i_output;
    do {
      local_38 = *puVar2;
      local_d8 = local_e0;
      local_d0._M_buckets = &local_d0._M_single_bucket;
      local_d0._M_bucket_count = 1;
      local_d0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_d0._M_element_count = 0;
      local_d0._M_rehash_policy._M_max_load_factor = 1.0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      pvStack_50 = (void *)0x0;
      local_68 = (void *)0x0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      pvStack_80 = (void *)0x0;
      local_98 = (void *)0x0;
      uStack_90 = 0;
      local_d0._M_rehash_policy._M_next_resize = 0;
      local_d0._M_single_bucket = (__node_base_ptr)0x0;
      local_f8.m_feature_table =
           (tuple_type *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
           ::s_table;
      QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      ::add_test_case((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                       *)&local_d8,&local_f8,
                      PutInt<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::put,PutInt<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                            ::reentrant_put,
                      PutInt<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::consume,
                      PutInt<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::reentrant_consume);
      local_f8.m_feature_table =
           (tuple_type *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_char>
           ::s_table;
      QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      ::add_test_case((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                       *)&local_d8,&local_f8,
                      PutUInt8<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::put,PutUInt8<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                            ::reentrant_put,
                      PutUInt8<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::consume,
                      PutUInt8<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::reentrant_consume);
      local_f8.m_feature_table =
           (tuple_type *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_short>
           ::s_table;
      QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      ::add_test_case((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                       *)&local_d8,&local_f8,
                      PutUInt16<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::put,PutUInt16<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                            ::reentrant_put,
                      PutUInt16<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::consume,
                      PutUInt16<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::reentrant_consume);
      local_f8.m_feature_table =
           (tuple_type *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
           ::s_table;
      QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      ::add_test_case((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                       *)&local_d8,&local_f8,
                      PutString<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::put,PutString<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                            ::reentrant_put,
                      PutString<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::consume,
                      PutString<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::reentrant_consume);
      local_f8.m_feature_table =
           (tuple_type *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<128ul,8ul>>
           ::s_table;
      QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      ::add_test_case((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                       *)&local_d8,&local_f8,
                      PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_128UL,_8UL>
                      ::put,PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_128UL,_8UL>
                            ::reentrant_put,
                      PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_128UL,_8UL>
                      ::consume,
                      PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_128UL,_8UL>
                      ::reentrant_consume);
      local_f8.m_feature_table =
           (tuple_type *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<256ul,128ul>>
           ::s_table;
      QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      ::add_test_case((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                       *)&local_d8,&local_f8,
                      PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_256UL,_128UL>
                      ::put,PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_256UL,_128UL>
                            ::reentrant_put,
                      PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_256UL,_128UL>
                      ::consume,
                      PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_256UL,_128UL>
                      ::reentrant_consume);
      local_f8.m_feature_table =
           (tuple_type *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<2048ul,2048ul>>
           ::s_table;
      QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      ::add_test_case((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                       *)&local_d8,&local_f8,
                      PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_2048UL,_2048UL>
                      ::put,PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_2048UL,_2048UL>
                            ::reentrant_put,
                      PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_2048UL,_2048UL>
                      ::consume,
                      PutTestObject<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>,_2048UL,_2048UL>
                      ::reentrant_consume);
      local_f8.m_feature_table =
           (tuple_type *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
           ::s_table;
      QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      ::add_test_case((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                       *)&local_d8,&local_f8,
                      PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::put,PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                            ::reentrant_put,
                      PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::consume,
                      PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::reentrant_consume);
      local_f8.m_feature_table =
           (tuple_type *)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_int>
           ::s_table;
      QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      ::add_test_case((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                       *)&local_d8,&local_f8,
                      ReentrantPush<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::put,ReentrantPush<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                            ::reentrant_put,
                      ReentrantPush<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::consume,
                      ReentrantPush<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                      ::reentrant_consume);
      QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      ::run((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
             *)&local_d8,i_flags,local_f0,local_e8);
      if (pvStack_50 != (void *)0x0) {
        operator_delete(pvStack_50);
      }
      if (local_68 != (void *)0x0) {
        operator_delete(local_68);
      }
      if (pvStack_80 != (void *)0x0) {
        operator_delete(pvStack_80);
      }
      if (local_98 != (void *)0x0) {
        operator_delete(local_98);
      }
      std::
      _Hashtable<density::runtime_type<>,_std::pair<const_density::runtime_type<>,_unsigned_long>,_std::allocator<std::pair<const_density::runtime_type<>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<density::runtime_type<>_>,_std::hash<density::runtime_type<>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_d0);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  return;
}

Assistant:

void single_queue_generic_test(
          QueueTesterFlags    i_flags,
          std::ostream &      i_output,
          EasyRandom &        i_random,
          size_t              i_element_count,
          std::vector<size_t> i_thread_count_vector)
        {
            for (auto thread_count : i_thread_count_vector)
            {
                QueueGenericTester<QUEUE> tester(i_output, thread_count);
                tester.template add_test_case<PutInt<QUEUE>>();
                tester.template add_test_case<PutUInt8<QUEUE>>();
                tester.template add_test_case<PutUInt16<QUEUE>>();
                tester.template add_test_case<PutString<QUEUE>>();
                tester.template add_test_case<PutTestObject<QUEUE, 128, 8>>();
                tester.template add_test_case<PutTestObject<QUEUE, 256, 128>>();
                tester.template add_test_case<PutTestObject<QUEUE, 2048, 2048>>();
                tester.template add_test_case<PutRawBlocks<QUEUE>>();
                tester.template add_test_case<ReentrantPush<QUEUE>>();

                tester.run(i_flags, i_random, i_element_count);
            }
        }